

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

BVSparse<Memory::JitArenaAllocator> * __thiscall
BasicBlock::EnsureTypeIDsWithFinalType(BasicBlock *this,JitArenaAllocator *alloc)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  
  if (this->typeIDsWithFinalType == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar1 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,alloc,0x3f1274);
    pBVar1->head = (Type_conflict)0x0;
    pBVar1->lastFoundIndex = (Type_conflict)0x0;
    pBVar1->alloc = alloc;
    pBVar1->lastUsedNodePrevNextField = (Type)pBVar1;
    this->typeIDsWithFinalType = pBVar1;
  }
  return this->typeIDsWithFinalType;
}

Assistant:

BVSparse<JitArenaAllocator> *
BasicBlock::EnsureTypeIDsWithFinalType(JitArenaAllocator *alloc)
{
    if (typeIDsWithFinalType == nullptr)
    {
         typeIDsWithFinalType = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    }
    return typeIDsWithFinalType;
}